

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

ssize_t zip_entries_delete_mark(zip_t *zip,zip_entry_mark_t *entry_mark,int entry_num)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  mz_zip_internal_state *pmVar4;
  mz_zip_internal_state *pmVar5;
  FILE *__stream;
  void *pvVar6;
  ulong uVar7;
  int i;
  int iVar8;
  void *__ptr;
  long lVar9;
  size_t sVar10;
  void *pvVar11;
  size_t sVar12;
  void *pvVar13;
  int iVar14;
  long lVar15;
  size_t *psVar16;
  ulong __off;
  long lVar17;
  int iVar18;
  long lVar19;
  size_t __nmemb;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  int i_1;
  ulong __off_00;
  ulong uVar25;
  bool bVar26;
  ulong uStack_b0;
  int local_7c;
  
  __nmemb = (size_t)entry_num;
  __ptr = calloc(__nmemb,4);
  if (__ptr == (void *)0x0) {
    uStack_b0 = 0xffffffffffffffeb;
  }
  else {
    pmVar4 = (zip->archive).m_pState;
    (zip->archive).m_zip_mode = MZ_ZIP_MODE_WRITING;
    if (((FILE *)pmVar4->m_pFile == (FILE *)0x0) ||
       (iVar8 = fseeko((FILE *)pmVar4->m_pFile,0,0), iVar8 == 0)) {
      lVar17 = 0;
      uVar20 = 0;
      local_7c = 0;
      uVar23 = 0;
      uVar24 = 0;
      uStack_b0 = 0;
      while (local_7c < entry_num) {
        lVar15 = (long)local_7c;
        lVar9 = lVar15 << 0x20;
        psVar16 = &entry_mark[lVar15].lf_length;
        for (lVar19 = 0; sVar10 = __nmemb, iVar8 = entry_num, lVar15 - __nmemb != lVar19;
            lVar19 = lVar19 + -1) {
          if (*(zip_modify_t *)(psVar16 + -2) != MZ_KEEP) {
            sVar10 = lVar9 >> 0x20;
            iVar8 = local_7c - (int)lVar19;
            break;
          }
          uVar23 = uVar24 + *psVar16;
          lVar9 = lVar9 + 0x100000000;
          psVar16 = psVar16 + 4;
          uVar24 = uVar23;
        }
        if (iVar8 <= entry_num) {
          iVar8 = entry_num;
        }
        psVar16 = &entry_mark[sVar10].lf_length;
        uVar25 = uStack_b0;
        for (; (long)sVar10 < (long)__nmemb; sVar10 = sVar10 + 1) {
          if (*(zip_modify_t *)(psVar16 + -2) != MZ_DELETE) {
            iVar8 = (int)sVar10;
            break;
          }
          *(undefined4 *)((long)__ptr + sVar10 * 4) = 1;
          uVar23 = uVar23 + *psVar16;
          lVar17 = lVar17 + *psVar16;
          uVar25 = uVar25 + 1;
          psVar16 = psVar16 + 4;
        }
        lVar9 = (long)iVar8;
        local_7c = entry_num;
        if (entry_num < iVar8) {
          local_7c = iVar8;
        }
        psVar16 = &entry_mark[lVar9].lf_length;
        for (; lVar9 < (long)__nmemb; lVar9 = lVar9 + 1) {
          if (*(zip_modify_t *)(psVar16 + -2) != MZ_MOVE) {
            local_7c = (int)lVar9;
            break;
          }
          pvVar11 = (pmVar4->m_central_dir).m_p;
          if (pvVar11 == (void *)0x0) goto LAB_0010ebdd;
          uVar20 = uVar20 + *psVar16;
          piVar1 = (int *)((long)pvVar11 +
                          (ulong)*(uint *)((long)(pmVar4->m_central_dir_offsets).m_p + lVar9 * 4) +
                          0x2a);
          *piVar1 = *piVar1 - (int)lVar17;
          psVar16 = psVar16 + 4;
        }
        pmVar5 = (zip->archive).m_pState;
        pvVar11 = calloc(1,0x1000);
        uStack_b0 = 0xffffffffffffffeb;
        if (pvVar11 != (void *)0x0) {
          uStack_b0 = 0;
          __off = uVar23;
          __off_00 = uVar24;
          for (uVar21 = uVar20; 0 < (long)uVar21; uVar21 = uVar21 - sVar10) {
            sVar10 = 0x1000;
            if (uVar21 < 0x1000) {
              sVar10 = uVar21;
            }
            __stream = (FILE *)pmVar5->m_pFile;
            if (__stream == (FILE *)0x0) {
              pvVar6 = pmVar5->m_pMem;
              if (pvVar6 == (void *)0x0) {
                uStack_b0 = 0xffffffffffffffed;
                goto LAB_0010eea0;
              }
              uVar7 = pmVar5->m_mem_size;
              if ((__off_00 <= uVar7) && (__off <= uVar7)) {
                if (((long)((long)pvVar6 + __off_00) + sVar10 <= uVar7 + (long)pvVar6) &&
                   ((long)((long)pvVar6 + __off) + sVar10 <= uVar7 + (long)pvVar6)) {
                  memmove((void *)((long)pvVar6 + __off_00),(void *)((long)pvVar6 + __off),sVar10);
                  goto LAB_0010ee41;
                }
              }
              uStack_b0 = 0xfffffffffffffff6;
              break;
            }
            iVar8 = fseeko(__stream,__off,0);
            if (iVar8 != 0) {
LAB_0010ee66:
              uStack_b0 = 0xffffffffffffffe5;
              break;
            }
            sVar12 = fread(pvVar11,1,sVar10,__stream);
            if (sVar12 != sVar10) {
              uStack_b0 = 0xffffffffffffffe4;
              break;
            }
            iVar8 = fseeko(__stream,__off_00,0);
            if (iVar8 != 0) goto LAB_0010ee66;
            sVar12 = fwrite(pvVar11,1,sVar10,__stream);
            if (sVar12 != sVar10) {
              uStack_b0 = 0xffffffffffffffe3;
              break;
            }
LAB_0010ee41:
            __off_00 = __off_00 + sVar10;
            __off = __off + sVar10;
            uStack_b0 = uStack_b0 + sVar10;
          }
          free(pvVar11);
        }
LAB_0010eea0:
        if (uStack_b0 != uVar20) goto LAB_0010f122;
        uVar24 = uVar24 + uVar20;
        uVar23 = uVar23 + uVar20;
        uStack_b0 = uVar25;
      }
      (zip->archive).m_archive_size = (zip->archive).m_archive_size - lVar17;
      (zip->archive).m_total_files = entry_num - (int)uStack_b0;
      iVar8 = 0;
      while (iVar8 < entry_num) {
        lVar17 = (long)iVar8;
        lVar9 = lVar17 << 0x20;
        for (lVar15 = 0; sVar10 = __nmemb, iVar14 = entry_num, __nmemb - lVar17 != lVar15;
            lVar15 = lVar15 + 1) {
          if (*(int *)((long)__ptr + lVar15 * 4 + lVar17 * 4) != 0) {
            sVar10 = lVar9 >> 0x20;
            iVar14 = iVar8 + (int)lVar15;
            break;
          }
          lVar9 = lVar9 + 0x100000000;
        }
        sVar12 = sVar10;
        iVar8 = entry_num;
        if (entry_num < iVar14) {
          iVar8 = iVar14;
        }
        for (; (long)sVar12 < (long)__nmemb; sVar12 = sVar12 + 1) {
          if (*(int *)((long)__ptr + sVar12 * 4) == 0) {
            iVar8 = (int)sVar12;
            break;
          }
        }
        if (iVar14 != entry_num) {
          pvVar11 = (pmVar4->m_central_dir_offsets).m_p;
          uVar2 = *(uint *)((long)pvVar11 + sVar10 * 4);
          uVar24 = (ulong)uVar2;
          if (iVar8 == entry_num) {
            sVar10 = 0;
          }
          else {
            pvVar6 = (pmVar4->m_central_dir).m_p;
            lVar17 = (long)iVar8;
            uVar3 = *(uint *)((long)pvVar11 + lVar17 * 4);
            pvVar11 = (void *)((long)pvVar6 + (ulong)uVar3);
            sVar10 = (pmVar4->m_central_dir).m_size - (ulong)uVar3;
            bVar26 = pvVar6 != (void *)0x0;
            if ((bVar26) && (uVar2 == 0)) {
              memmove(pvVar6,pvVar11,sVar10);
              pvVar13 = realloc((pmVar4->m_central_dir).m_p,sVar10);
              (pmVar4->m_central_dir).m_p = pvVar13;
              for (lVar9 = lVar17; lVar9 < (long)__nmemb; lVar9 = lVar9 + 1) {
                piVar1 = (int *)((long)(pmVar4->m_central_dir_offsets).m_p + lVar9 * 4);
                *piVar1 = *piVar1 - (uVar3 - uVar2);
              }
              bVar26 = true;
            }
            if ((bVar26) && (sVar10 * uVar24 != 0)) {
              memmove((void *)((long)pvVar6 + uVar24),pvVar11,sVar10);
              for (; lVar17 < (long)__nmemb; lVar17 = lVar17 + 1) {
                piVar1 = (int *)((long)(pmVar4->m_central_dir_offsets).m_p + lVar17 * 4);
                *piVar1 = *piVar1 - (uVar3 - uVar2);
              }
            }
          }
          (pmVar4->m_central_dir).m_size = sVar10 + uVar24;
        }
      }
      iVar14 = 0;
      iVar8 = 0;
      while (iVar8 < entry_num) {
        lVar9 = (long)iVar8;
        lVar15 = lVar9 << 0x20;
        lVar17 = 0;
        while( true ) {
          if (__nmemb - lVar9 == lVar17) goto LAB_0010f109;
          if (*(int *)((long)__ptr + lVar17 * 4 + lVar9 * 4) != 0) break;
          lVar15 = lVar15 + 0x100000000;
          lVar17 = lVar17 + 1;
        }
        iVar18 = (int)lVar17;
        if (iVar18 + (iVar8 - entry_num) == 0) break;
        lVar15 = lVar15 >> 0x20;
        lVar17 = lVar15;
        iVar22 = iVar8 + iVar18;
        if (iVar8 + iVar18 <= entry_num) {
          iVar22 = entry_num;
        }
        for (; lVar17 < (long)__nmemb; lVar17 = lVar17 + 1) {
          if (*(int *)((long)__ptr + lVar17 * 4) == 0) {
            iVar22 = (int)lVar17;
            break;
          }
        }
        for (lVar17 = (long)iVar22; lVar17 < (long)__nmemb; lVar17 = lVar17 + 1) {
          pvVar11 = (pmVar4->m_central_dir_offsets).m_p;
          *(undefined4 *)((long)pvVar11 + lVar15 * 4) = *(undefined4 *)((long)pvVar11 + lVar17 * 4);
          lVar15 = lVar15 + 1;
        }
        iVar14 = ((iVar14 - iVar8) + iVar22) - iVar18;
        iVar8 = iVar22;
      }
LAB_0010f109:
      (pmVar4->m_central_dir_offsets).m_size = (long)(entry_num - iVar14) << 2;
LAB_0010f122:
      free(__ptr);
    }
    else {
LAB_0010ebdd:
      free(__ptr);
      uStack_b0 = 0xfffffffffffffffd;
    }
  }
  return uStack_b0;
}

Assistant:

static ssize_t zip_entries_delete_mark(struct zip_t *zip,
                                       struct zip_entry_mark_t *entry_mark,
                                       int entry_num) {
  mz_uint64 writen_num = 0;
  mz_uint64 read_num = 0;
  size_t deleted_length = 0;
  size_t move_length = 0;
  int i = 0;
  size_t deleted_entry_num = 0;
  ssize_t n = 0;

  mz_bool *deleted_entry_flag_array =
      (mz_bool *)calloc(entry_num, sizeof(mz_bool));
  if (deleted_entry_flag_array == NULL) {
    return ZIP_EOOMEM;
  }

  mz_zip_internal_state *pState = zip->archive.m_pState;
  zip->archive.m_zip_mode = MZ_ZIP_MODE_WRITING;

  if (pState->m_pFile) {
    if (MZ_FSEEK64(pState->m_pFile, 0, SEEK_SET)) {
      CLEANUP(deleted_entry_flag_array);
      return ZIP_ENOENT;
    }
  }

  while (i < entry_num) {
    while ((i < entry_num) && (entry_mark[i].type == MZ_KEEP)) {
      writen_num += entry_mark[i].lf_length;
      read_num = writen_num;
      i++;
    }

    while ((i < entry_num) && (entry_mark[i].type == MZ_DELETE)) {
      deleted_entry_flag_array[i] = MZ_TRUE;
      read_num += entry_mark[i].lf_length;
      deleted_length += entry_mark[i].lf_length;
      i++;
      deleted_entry_num++;
    }

    while ((i < entry_num) && (entry_mark[i].type == MZ_MOVE)) {
      move_length += entry_mark[i].lf_length;
      mz_uint8 *p = &MZ_ZIP_ARRAY_ELEMENT(
          &pState->m_central_dir, mz_uint8,
          MZ_ZIP_ARRAY_ELEMENT(&pState->m_central_dir_offsets, mz_uint32, i));
      if (!p) {
        CLEANUP(deleted_entry_flag_array);
        return ZIP_ENOENT;
      }
      mz_uint32 offset = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
      offset -= (mz_uint32)deleted_length;
      MZ_WRITE_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS, offset);
      i++;
    }

    n = zip_files_move(zip, writen_num, read_num, move_length);
    if (n != (ssize_t)move_length) {
      CLEANUP(deleted_entry_flag_array);
      return n;
    }
    writen_num += move_length;
    read_num += move_length;
  }

  zip->archive.m_archive_size -= (mz_uint64)deleted_length;
  zip->archive.m_total_files =
      (mz_uint32)entry_num - (mz_uint32)deleted_entry_num;

  zip_central_dir_delete(pState, deleted_entry_flag_array, entry_num);
  CLEANUP(deleted_entry_flag_array);

  return (ssize_t)deleted_entry_num;
}